

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_key.h
# Opt level: O3

bool __thiscall cppcms::string_key::operator==(string_key *this,string_key *other)

{
  int iVar1;
  char *__s2;
  char *pcVar2;
  char *pcVar3;
  char *__s1;
  
  __s1 = this->begin_;
  if (__s1 == (char *)0x0) {
    __s1 = (this->key_)._M_dataplus._M_p;
    pcVar3 = __s1 + (this->key_)._M_string_length;
  }
  else {
    pcVar3 = this->end_;
  }
  __s2 = other->begin_;
  if (__s2 == (char *)0x0) {
    __s2 = (other->key_)._M_dataplus._M_p;
    pcVar2 = __s2 + (other->key_)._M_string_length;
  }
  else {
    pcVar2 = other->end_;
  }
  if ((long)pcVar3 - (long)__s1 == (long)pcVar2 - (long)__s2) {
    iVar1 = bcmp(__s1,__s2,(long)pcVar3 - (long)__s1);
    return iVar1 == 0;
  }
  return false;
}

Assistant:

bool operator==(string_key const &other) const
		{
			return (end() - begin() == other.end() - other.begin())
				&& memcmp(begin(),other.begin(),end()-begin()) == 0;
		}